

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O1

void Map_CutTableRestart(Map_CutTable_t *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = p->nCuts;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      if (p->pBins[p->pCuts[lVar2]] == (Map_Cut_t *)0x0) {
        __assert_fail("p->pBins[ p->pCuts[i] ]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                      ,0x3c1,"void Map_CutTableRestart(Map_CutTable_t *)");
      }
      p->pBins[p->pCuts[lVar2]] = (Map_Cut_t *)0x0;
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  p->nCuts = 0;
  return;
}

Assistant:

void Map_CutTableRestart( Map_CutTable_t * p )
{
    int i;
    for ( i = 0; i < p->nCuts; i++ )
    {
        assert( p->pBins[ p->pCuts[i] ] );
        p->pBins[ p->pCuts[i] ] = NULL;
    }
    p->nCuts = 0;
}